

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall Omega_h::Write<long>::Write(Write<long> *this,HostWrite<long> *host_write)

{
  size_t in_RCX;
  void *in_RDX;
  Write<int> local_20;
  
  HostWrite<long>::write((HostWrite<long> *)&local_20,(int)host_write,in_RDX,in_RCX);
  Write((Write<int> *)this,&local_20);
  ~Write((Write<long> *)&local_20);
  return;
}

Assistant:

Write<T>::Write(HostWrite<T> host_write) : Write<T>(host_write.write()) {}